

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void scalar_centered_binomial_distribution_eta_2_with_prf(scalar *out,uint8_t *input)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  uint8_t entropy [128];
  byte local_98 [136];
  
  pbVar4 = local_98;
  BORINGSSL_keccak(local_98,0x80,input,0x21,boringssl_shake256);
  uVar2 = 0xfffffffffffffffe;
  do {
    bVar1 = *pbVar4;
    iVar3 = ((int)((uint)bVar1 << 0x1c) >> 0x1f) + (bVar1 & 1) +
            ((int)((uint)bVar1 << 0x1d) >> 0x1f) + (uint)((bVar1 >> 1 & 1) != 0);
    out->c[uVar2 + 2] = ((ushort)(iVar3 >> 0x1f) & 0xd01) + (short)iVar3;
    iVar3 = (((int)((uint)bVar1 << 0x19) >> 0x1f) -
            ((uint)(bVar1 >> 7) - (uint)((bVar1 >> 4 & 1) != 0))) + (uint)((bVar1 >> 5 & 1) != 0);
    out->c[uVar2 + 3] = ((ushort)(iVar3 >> 0x1f) & 0xd01) + (short)iVar3;
    uVar2 = uVar2 + 2;
    pbVar4 = pbVar4 + 1;
  } while (uVar2 < 0xfe);
  return;
}

Assistant:

static void scalar_centered_binomial_distribution_eta_2_with_prf(
    scalar *out, const uint8_t input[33]) {
  uint8_t entropy[128];
  static_assert(sizeof(entropy) == 2 * /*kEta=*/2 * DEGREE / 8, "");
  prf(entropy, sizeof(entropy), input);

  for (int i = 0; i < DEGREE; i += 2) {
    uint8_t byte = entropy[i / 2];

    uint16_t value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // Add |kPrime| if |value| underflowed. See |reduce_once| for a discussion
    // on why the value barrier is omitted. While this could have been written
    // reduce_once(value + kPrime), this is one extra addition and small range
    // of |value| tempts some versions of Clang to emit a branch.
    uint16_t mask = 0u - (value >> 15);
    out->c[i] = value + (kPrime & mask);

    byte >>= 4;
    value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // See above.
    mask = 0u - (value >> 15);
    out->c[i + 1] = value + (kPrime & mask);
  }
}